

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O3

void nes_defchr(int *ip)

{
  int iVar1;
  char last_char;
  long lVar2;
  uint data [8];
  uchar buffer [16];
  uint local_58 [8];
  uchar local_38 [24];
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_size = 3;
  data_level = 3;
  lVar2 = 0;
  while( true ) {
    last_char = ',';
    if (lVar2 == 7) {
      last_char = ';';
    }
    iVar1 = evaluate(ip,last_char);
    if (iVar1 == 0) break;
    local_58[lVar2] = value;
    lVar2 = lVar2 + 1;
    if (lVar2 == 8) {
      nes_pack_8x8_tile(local_38,local_58,0,2);
      putbuffer(local_38,0x10);
      if (pass == 1) {
        println();
      }
      return;
    }
  }
  return;
}

Assistant:

void
nes_defchr(int *ip)
{
	unsigned char buffer[16];
	unsigned int data[8];
	int size;
	int i;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_size   = 3;
	data_level  = 3;

	/* get tile data */
	for (i = 0; i < 8; i++) {
		/* get value */
		if (!evaluate(ip, (i < 7) ? ',' : ';'))
			return;

		/* store value */
		data[i] = value;
	}

	/* encode tile */
	size = nes_pack_8x8_tile(buffer, data, 0, PACKED_TILE);

	/* store tile */
	putbuffer(buffer, size);

	/* output line */
	if (pass == LAST_PASS)
		println();
}